

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

int arti_invoke(obj *obj)

{
  uchar uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  schar sVar7;
  char cVar8;
  boolean bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  obj *poVar16;
  nh_menuitem *items;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  int tmp;
  int iVar20;
  obj *poVar21;
  artifact *paVar22;
  dungeon *__src;
  int iVar23;
  ulong uVar24;
  int n;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  byte bVar28;
  boolean unused_known;
  obj pseudo;
  boolean local_a1;
  d_level *local_a0;
  obj local_98;
  
  uVar10 = moves;
  bVar28 = 0;
  if ((obj == (obj *)0x0) || ((long)obj->oartifact == 0)) {
    paVar22 = (artifact *)0x0;
  }
  else {
    paVar22 = artilist + obj->oartifact;
  }
  if (paVar22 != (artifact *)0x0) {
    uVar26 = (ulong)paVar22->inv_prop;
    if (uVar26 != 0) {
      if (paVar22->inv_prop < 0x43) {
        uVar10 = u.uprops[uVar26].extrinsic;
        uVar12 = u.uprops[uVar26].intrinsic;
        uVar13 = uVar10 ^ 0x2000;
        u.uprops[uVar26].extrinsic = uVar13;
        uVar25 = moves;
        if ((uVar13 >> 0xd & 1) == 0) {
LAB_0014b64e:
          local_a0 = (d_level *)CONCAT44(local_a0._4_4_,uVar12);
          uVar10 = mt_random();
          uVar12 = 1;
          do {
            uVar11 = mt_random();
            if (1 < uVar11 % 6) goto LAB_0014b6b6;
            uVar12 = uVar12 + 1;
          } while (uVar12 != 10);
          uVar12 = 10;
LAB_0014b6b6:
          uVar26 = (ulong)uVar12 * (ulong)(uVar10 % 1000 + 1000);
          uVar10 = mt_random();
          if ((uVar10 & 1) == 0) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar26;
            iVar20 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar3,0);
          }
          else {
            iVar20 = (int)(uVar26 / 10);
          }
          obj->age = uVar25 + iVar20;
          uVar12 = (uint)local_a0;
        }
        else {
          if (moves < (uint)obj->age) {
            u.uprops[uVar26].extrinsic = uVar10;
            pcVar14 = xname(obj);
            pcVar14 = the(pcVar14);
            pcVar15 = otense(obj,"are");
            pline("You feel that %s %s ignoring you.",pcVar14,pcVar15);
            iVar20 = 3;
            iVar23 = -3;
            do {
              uVar10 = mt_random();
              iVar20 = iVar20 + uVar10 % 10;
              iVar23 = iVar23 + 1;
            } while (iVar23 != 0);
            goto LAB_0014b80b;
          }
          if ((uVar13 >> 0xd & 1) == 0) goto LAB_0014b64e;
        }
        if (((uVar13 & 0xffffdfff) != 0) || (uVar12 != 0)) goto LAB_0014c091;
        uVar1 = paVar22->inv_prop;
        if (uVar1 == '\r') {
          if ((u.uprops[0xd].blocked != 0) ||
             (((u.uprops[0x1e].intrinsic != 0 ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
              ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))))) goto LAB_0014c091;
          newsym((int)u.ux,(int)u.uy);
          if ((uVar13 >> 0xd & 1) != 0) {
            pcVar14 = "strange";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar14 = "normal";
              }
              else {
                bVar9 = dmgtype(youmonst.data,0x24);
                pcVar14 = "strange";
                if (bVar9 == '\0') {
                  pcVar14 = "normal";
                }
              }
            }
            pline("Your body takes on a %s transparency...",pcVar14);
            return 1;
          }
          pcVar14 = "Your body seems to unfade...";
        }
        else {
          if (uVar1 == '\x12') {
            if ((uVar13 >> 0xd & 1) == 0) {
              float_down(0x10ffffff,0x2000);
              return 1;
            }
            float_up();
            spoteffects('\0');
            return 1;
          }
          if (uVar1 != '\x15') {
            return 1;
          }
          if ((uVar13 >> 0xd & 1) == 0) {
            pcVar14 = "You feel the tension decrease around you.";
          }
          else {
            pcVar14 = "You feel like a rabble-rouser.";
          }
        }
        goto LAB_0014b920;
      }
      if (moves < (uint)obj->age) {
        pcVar14 = xname(obj);
        pcVar14 = the(pcVar14);
        pcVar15 = otense(obj,"are");
        pline("You feel that %s %s ignoring you.",pcVar14,pcVar15);
        iVar20 = 3;
        iVar23 = -3;
        do {
          uVar10 = mt_random();
          iVar20 = iVar20 + uVar10 % 10;
          iVar23 = iVar23 + 1;
        } while (iVar23 != 0);
LAB_0014b80b:
        obj->age = obj->age + iVar20;
        return 1;
      }
      uVar12 = mt_random();
      uVar25 = 1;
      do {
        uVar13 = mt_random();
        if (1 < uVar13 % 6) goto LAB_0014b767;
        uVar25 = uVar25 + 1;
      } while (uVar25 != 10);
      uVar25 = 10;
LAB_0014b767:
      uVar26 = (ulong)uVar25 * (ulong)(uVar12 % 1000 + 1000);
      uVar12 = mt_random();
      if ((uVar12 & 1) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar26;
        iVar20 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar4,0);
      }
      else {
        iVar20 = (int)(uVar26 / 10);
      }
      iVar20 = uVar10 + iVar20;
      obj->age = iVar20;
      uVar10 = u.ucreamed;
      switch(paVar22->inv_prop) {
      case 'C':
        poVar16 = &zeroobj;
        poVar21 = &local_98;
        for (lVar18 = 0xd; lVar18 != 0; lVar18 = lVar18 + -1) {
          poVar21->nobj = poVar16->nobj;
          poVar16 = (obj *)((long)poVar16 + ((ulong)bVar28 * -2 + 1) * 8);
          poVar21 = (obj *)((long)poVar21 + (ulong)bVar28 * -0x10 + 8);
        }
        local_98.otyp = 0x159;
        seffects(&local_98,&local_a1);
        return 1;
      case 'D':
        iVar20 = u.mhmax - u.mh;
        if (u.umonnum == u.umonster) {
          iVar20 = u.uhpmax - u.uhp;
        }
        bVar27 = iVar20 - 1U < 0xfffffffd;
        bVar5 = u.uprops[0x3a].intrinsic != 0;
        bVar6 = u.uprops[0x1d].intrinsic != 0;
        bVar2 = u.ucreamed < u.uprops[0x1e].intrinsic;
        if ((u.ucreamed < u.uprops[0x1e].intrinsic || (bVar5 || bVar6)) || bVar27) {
          pline("You feel better.");
          if (1 < iVar20 + 1) {
            piVar19 = &u.mh;
            if (u.umonnum == u.umonster) {
              piVar19 = &u.uhp;
            }
            *piVar19 = *piVar19 + ((iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1);
          }
          if (u.uprops[0x1d].intrinsic != 0) {
            make_sick(0,(char *)0x0,'\0',3);
          }
          if (u.uprops[0x3a].intrinsic != 0) {
            u.uprops[0x3a].intrinsic = 0;
          }
          if (uVar10 < u.uprops[0x1e].intrinsic) {
            make_blinded((ulong)uVar10,'\0');
          }
          iflags.botl = '\x01';
          if ((bVar2 || (bVar5 || bVar6)) || bVar27) {
            iflags.botl = '\x01';
            return 1;
          }
        }
        break;
      case 'E':
        iVar20 = (u.uenmax - u.uen) + 1;
        iVar23 = 0x78;
        if ((iVar20 < 0xf2) && (iVar23 = iVar20 / 2, iVar20 < 0x18)) {
          iVar23 = u.uenmax - u.uen;
        }
        if (iVar23 != 0) {
          pline("You feel re-energized.");
          iflags.botl = '\x01';
          u.uen = u.uen + iVar23;
          return 1;
        }
        break;
      case 'F':
        iVar20 = untrap('\x01');
        if (iVar20 != 0) {
          return 1;
        }
        obj->age = 0;
        return 0;
      case 'G':
        poVar16 = getobj("\x13\x14","charge",(obj **)0x0);
        if (poVar16 == (obj *)0x0) {
          obj->age = 0;
        }
        else {
          if (((*(uint *)&obj->field_0x4a & 2) == 0) ||
             (iVar20 = 1, paVar22->role != 0 && urole.malenum != paVar22->role)) {
            iVar20 = -(*(uint *)&obj->field_0x4a & 1);
          }
          recharge(poVar16,iVar20);
          update_inventory();
        }
        if (poVar16 != (obj *)0x0) {
          return 1;
        }
        return 0;
      case 'H':
        level_tele();
        return 1;
      case 'I':
        bVar9 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
        if ((bVar9 == '\0') || (u.ushops[0] == '\0')) {
          local_a0 = &u.uz;
          uVar26 = (ulong)n_dgns;
          items = (nh_menuitem *)malloc(uVar26 * 0x10c);
          if ((long)uVar26 < 1) {
            iVar23 = 0;
            iVar20 = 0;
          }
          else {
            __src = dungeons;
            uVar24 = 0;
            iVar20 = 0;
            uVar17 = 0;
            do {
              if (__src->dunlev_ureached != '\0') {
                items[iVar20].id = (int)uVar24 + 1;
                items[iVar20].accel = '\0';
                items[iVar20].role = MI_NORMAL;
                items[iVar20].selected = '\0';
                strcpy(items[iVar20].caption,__src->dname);
                iVar20 = iVar20 + 1;
                uVar17 = uVar24 & 0xffffffff;
              }
              iVar23 = (int)uVar17;
              uVar24 = uVar24 + 1;
              __src = __src + 1;
            } while (uVar26 != uVar24);
          }
          if (iVar20 < 2) {
            free(items);
LAB_0014bffe:
            local_98.nobj._0_4_ = CONCAT31(local_98.nobj._1_3_,(char)iVar23);
            iVar20 = dungeons[iVar23].depth_start;
            sVar7 = depth(local_a0);
            local_98.nobj._0_2_ =
                 CONCAT11(*(undefined1 *)
                           ((long)iVar23 * 0x38 + 0x31ce1c + (ulong)(iVar20 < sVar7) * 2),
                          (char)local_98.nobj);
            if ((((u.uhave._0_1_ & 1) != 0) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum))
               || ((char)local_98.nobj == dungeon_topology.d_astral_level.dnum ||
                   (char)local_98.nobj == u.uz.dnum)) goto LAB_0014c06c;
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              pcVar14 = "You are surrounded by a shimmering sphere!";
            }
            else {
              pcVar14 = "You feel weightless for a moment.";
            }
            pline(pcVar14);
            goto_level((d_level *)&local_98,'\0','\0','\0');
            goto LAB_0014c07a;
          }
          iVar20 = display_menu(items,iVar20,"Open a portal to which dungeon?",1,(int *)&local_98);
          free(items);
          iVar23 = (int)local_98.nobj + -1;
          if (0 < iVar20) goto LAB_0014bffe;
          cVar8 = (iVar20 < 1) * '\x03';
        }
        else {
LAB_0014c06c:
          pline("You feel very disoriented for a moment.");
LAB_0014c07a:
          cVar8 = '\x02';
        }
        if (cVar8 == '\x02') {
          return 1;
        }
        if (cVar8 != '\x03') {
          return iVar20;
        }
        break;
      case 'J':
        enlightenment(0);
        return 1;
      case 'K':
        poVar16 = mksobj(level,1,'\x01','\0');
        if (poVar16 == (obj *)0x0) break;
        uVar12 = *(uint *)&obj->field_0x4a & 2;
        uVar10 = *(uint *)&poVar16->field_0x4a;
        *(uint *)&poVar16->field_0x4a = uVar10 & 0xfffffffd | uVar12;
        uVar25 = *(uint *)&obj->field_0x4a & 1;
        *(uint *)&poVar16->field_0x4a = uVar10 & 0xfffffffc | uVar12 | uVar25;
        *(uint *)&poVar16->field_0x4a =
             uVar10 & 0xffffffbc | uVar12 | uVar25 | *(uint *)&obj->field_0x4a & 0x40;
        if ((*(uint *)&obj->field_0x4a & 2) == 0) {
          if ((*(uint *)&obj->field_0x4a & 1) == 0) {
            uVar12 = mt_random();
            uVar10 = uVar12 / 5;
            goto LAB_0014befb;
          }
          if ('\0' < poVar16->spe) {
            poVar16->spe = '\0';
          }
        }
        else {
          if (poVar16->spe < '\0') {
            poVar16->spe = '\0';
          }
          uVar12 = mt_random();
          uVar10 = (uVar12 / 10) * 2;
LAB_0014befb:
          poVar16->quan = uVar12 + uVar10 * -5 + poVar16->quan + 1;
        }
        uVar10 = weight(poVar16);
        poVar16->owt = uVar10;
        pcVar14 = aobjnam(poVar16,"fall");
        hold_another_object(poVar16,"Suddenly %s out.",pcVar14,(char *)0x0);
        if (poVar16 != (obj *)0x0) {
          return 1;
        }
        break;
      case 'L':
        if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
           (((youmonst.data)->mflags1 & 8) == 0)) {
          if (paVar22 == artilist + 0x1a) {
            if (uball != obj && uball != (obj *)0x0) {
              pcVar14 = yname(uball);
              pline("You are liberated from %s!",pcVar14);
              unpunish();
            }
            if (uball == (obj *)0x0) {
              poVar16 = mkobj(level,'\x10','\x01');
              setworn(poVar16,0x400000);
              setworn(obj,0x200000);
              uball->spe = '\x01';
              if ((u._1052_1_ & 1) == 0) {
                placebc();
                if (((u.uprops[0x1e].intrinsic != 0) ||
                    (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                     (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                   ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
                  set_bc(1);
                }
                newsym((int)u.ux,(int)u.uy);
              }
              pcVar14 = xname(obj);
              pline("Your %s chains itself to you!",pcVar14);
            }
          }
          pcVar14 = "Your body begins to feel less solid.";
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             ((u.umonnum == u.umonster || (bVar9 = dmgtype(youmonst.data,0x24), bVar9 == '\0')))) {
            pcVar14 = "You feel one with the spirit world.";
          }
          pline(pcVar14);
          uVar10 = mt_random();
          incr_itimeout(&u.uprops[0x3e].intrinsic,(ulong)(uVar10 % 100 + 0x33));
          obj->age = obj->age + u.uprops[0x3e].intrinsic;
          return 1;
        }
        break;
      default:
        return 1;
      }
LAB_0014c091:
      if (obj->where == '\x03') {
        pline("You feel a surge of power, but nothing seems to happen.");
        return 1;
      }
      return 1;
    }
  }
  cVar8 = obj->oclass;
  if ((cVar8 == '\x06') || (cVar8 == '\r')) {
    iVar20 = dorub(obj);
    return iVar20;
  }
  if (cVar8 == '\v') {
    iVar20 = do_break_wand(obj);
    return iVar20;
  }
  if ((ushort)obj->otyp - 0xd8 < 2) {
    iVar20 = invoke_amulet(obj);
    return iVar20;
  }
  if (obj->otyp == 0xec) {
    use_crystal_ball(obj);
    return 1;
  }
  pcVar14 = "Nothing happens.";
LAB_0014b920:
  pline(pcVar14);
  return 1;
}

Assistant:

static int arti_invoke(struct obj *obj)
{
    const struct artifact *oart = get_artifact(obj);

    if (!oart || !oart->inv_prop) {
        if (obj->oclass == WAND_CLASS)
            return do_break_wand(obj);
        else if (obj->oclass == GEM_CLASS || obj->oclass == TOOL_CLASS)
            return dorub(obj);
	else if (obj->otyp == CRYSTAL_BALL)
	    use_crystal_ball(obj);
	else if (obj->otyp == AMULET_OF_YENDOR ||
		 obj->otyp == FAKE_AMULET_OF_YENDOR)
	    /* The Amulet is not technically an artifact
	     * in the usual sense... */
	    return invoke_amulet(obj);
	else
	    pline("Nothing happens.");
	return 1;
    }

    if (oart->inv_prop > LAST_PROP) {
	/* It's a special power, not "just" a property */
	if (obj->age > moves) {
	    /* the artifact is tired :-) */
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* and just got more so; patience is essential... */
	    obj->age += (long) dice(3,10);
	    return 1;
	}
	obj->age = moves + rnz(100);

	switch(oart->inv_prop) {
	case TAMING: {
	    struct obj pseudo;
	    boolean unused_known;

	    pseudo = zeroobj;	/* neither cursed nor blessed */
	    pseudo.otyp = SCR_TAMING;
	    seffects(&pseudo, &unused_known);
	    break;
	  }
	case HEALING: {
	    int healamt = (u.uhpmax + 1 - u.uhp) / 2;
	    long creamed = (long)u.ucreamed;

	    if (Upolyd) healamt = (u.mhmax + 1 - u.mh) / 2;
	    if (healamt || Sick || Slimed || Blinded > creamed)
		pline("You feel better.");
	    else
		goto nothing_special;
	    if (healamt > 0) {
		if (Upolyd) u.mh += healamt;
		else u.uhp += healamt;
	    }
	    if (Sick) make_sick(0L,NULL,FALSE,SICK_ALL);
	    if (Slimed) Slimed = 0L;
	    if (Blinded > creamed) make_blinded(creamed, FALSE);
	    iflags.botl = 1;
	    break;
	  }
	case ENERGY_BOOST: {
	    int epboost = (u.uenmax + 1 - u.uen) / 2;
	    if (epboost > 120) epboost = 120;		/* arbitrary */
	    else if (epboost < 12) epboost = u.uenmax - u.uen;
	    if (epboost) {
		pline("You feel re-energized.");
		u.uen += epboost;
		iflags.botl = 1;
	    } else
		goto nothing_special;
	    break;
	  }
	case UNTRAP: {
	    if (!untrap(TRUE)) {
		obj->age = 0; /* don't charge for changing their mind */
		return 0;
	    }
	    break;
	  }
	case CHARGE_OBJ: {
	    struct obj *otmp = getobj(recharge_type, "charge", NULL);
	    boolean b_effect;

	    if (!otmp) {
		obj->age = 0;
		return 0;
	    }
	    b_effect = obj->blessed &&
		(Role_switch == oart->role || !oart->role);
	    recharge(otmp, b_effect ? 1 : obj->cursed ? -1 : 0);
	    update_inventory();
	    break;
	  }
	case LEV_TELE:
	    level_tele();
	    break;
	case CREATE_PORTAL: {
	    int i, num_ok_dungeons, last_ok_dungeon = 0;
	    d_level newlev;
	    extern int n_dgns; /* from dungeon.c */
	    struct nh_menuitem *items;

	    /* Prevent branchporting from the Black Market shop. */
	    if (Is_blackmarket(&u.uz) && *u.ushops) {
		pline("You feel very disoriented for a moment.");
		break;
	    }

	    items = malloc(n_dgns * sizeof(struct nh_menuitem));

	    num_ok_dungeons = 0;
	    for (i = 0; i < n_dgns; i++) {
		if (!dungeons[i].dunlev_ureached)
		    continue;
		items[num_ok_dungeons].id = i+1;
		items[num_ok_dungeons].accel = 0;
		items[num_ok_dungeons].role = MI_NORMAL;
		items[num_ok_dungeons].selected = FALSE;
		strcpy(items[num_ok_dungeons].caption, dungeons[i].dname);
		num_ok_dungeons++;
		last_ok_dungeon = i;
	    }

	    if (num_ok_dungeons > 1) {
		/* more than one entry; display menu for choices */
		int n;
		int selected[1];

		n = display_menu(items, num_ok_dungeons, "Open a portal to which dungeon?", PICK_ONE, selected);
		free(items);
		if (n <= 0)
		    goto nothing_special;
		
		i = selected[0] - 1;
	    } else {
		free(items);
		i = last_ok_dungeon;	/* also first & only OK dungeon */
	    }

	    /*
	     * i is now index into dungeon structure for the new dungeon.
	     * Find the closest level in the given dungeon, open
	     * a use-once portal to that dungeon and go there.
	     * The closest level is either the entry or dunlev_ureached.
	     */
	    newlev.dnum = i;
	    if (dungeons[i].depth_start >= depth(&u.uz))
		newlev.dlevel = dungeons[i].entry_lev;
	    else
		newlev.dlevel = dungeons[i].dunlev_ureached;
	    if (u.uhave.amulet || In_endgame(&u.uz) || In_endgame(&newlev) ||
	       newlev.dnum == u.uz.dnum) {
		pline("You feel very disoriented for a moment.");
	    } else {
		if (!Blind) pline("You are surrounded by a shimmering sphere!");
		else pline("You feel weightless for a moment.");
		goto_level(&newlev, FALSE, FALSE, FALSE);
	    }
	    break;
	  }
	case ENLIGHTENING:
	    enlightenment(0);
	    break;
	case CREATE_AMMO: {
	    struct obj *otmp = mksobj(level, ARROW, TRUE, FALSE);

	    if (!otmp) goto nothing_special;
	    otmp->blessed = obj->blessed;
	    otmp->cursed = obj->cursed;
	    otmp->bknown = obj->bknown;
	    if (obj->blessed) {
		if (otmp->spe < 0) otmp->spe = 0;
		otmp->quan += rnd(10);
	    } else if (obj->cursed) {
		if (otmp->spe > 0) otmp->spe = 0;
	    } else
		otmp->quan += rnd(5);
	    otmp->owt = weight(otmp);
	    hold_another_object(otmp, "Suddenly %s out.", aobjnam(otmp, "fall"), NULL);
	    break;
	  }
	case PHASING:	/* walk through walls and stone like a xorn */
	    if (Passes_walls) goto nothing_special;
	    if (oart == &artilist[ART_IRON_BALL_OF_LIBERATION]) {
		if (Punished && obj != uball) {
		    pline("You are liberated from %s!", yname(uball));
		    unpunish(); /* remove a mundane heavy iron ball */
		}

		if (!Punished) {
		    setworn(mkobj(level, CHAIN_CLASS, TRUE), W_CHAIN);
		    setworn(obj, W_BALL);
		    uball->spe = 1;	/* attach the Iron Ball of Liberation */
		    if (!u.uswallow) {
			placebc();
			if (Blind) set_bc(1);	/* set up ball and chain variables */
			newsym(u.ux, u.uy);	/* see ball&chain if can't see self */
		    }
		    pline("Your %s chains itself to you!", xname(obj));
		}
	    }
	    if (!Hallucination)
		pline("Your body begins to feel less solid.");
	    else
		pline("You feel one with the spirit world.");
	    incr_itimeout(&Phasing, (50 + rnd(100)));
	    obj->age += Phasing; /* Time begins after phasing ends */
	    break;
	}
    } else {
	long eprop = (u.uprops[oart->inv_prop].extrinsic ^= W_ARTI),
	     iprop = u.uprops[oart->inv_prop].intrinsic;
	boolean on = (eprop & W_ARTI) != 0; /* true if invoked prop just set */

	if (on && obj->age > moves) {
	    /* the artifact is tired :-) */
	    u.uprops[oart->inv_prop].extrinsic ^= W_ARTI;
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* can't just keep repeatedly trying */
	    obj->age += (long) dice(3,10);
	    return 1;
	} else if (!on) {
	    /* when turning off property, determine downtime */
	    /* arbitrary for now until we can tune this -dlc */
	    obj->age = moves + rnz(100);
	}

	if ((eprop & ~W_ARTI) || iprop) {
nothing_special:
	    /* you had the property from some other source too */
	    if (carried(obj))
		pline("You feel a surge of power, but nothing seems to happen.");
	    return 1;
	}
	switch(oart->inv_prop) {
	case CONFLICT:
	    if (on) pline("You feel like a rabble-rouser.");
	    else pline("You feel the tension decrease around you.");
	    break;
	case LEVITATION:
	    if (on) {
		float_up();
		spoteffects(FALSE);
	    } else float_down(I_SPECIAL|TIMEOUT, W_ARTI);
	    break;
	case INVIS:
	    if (BInvis || Blind) goto nothing_special;
	    newsym(u.ux, u.uy);
	    if (on)
		pline("Your body takes on a %s transparency...",
		     Hallucination ? "normal" : "strange");
	    else
		pline("Your body seems to unfade...");
	    break;
	}
    }

    return 1;
}